

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipEntry.hpp
# Opt level: O3

ZipEntryInfo * Zippy::Impl::ZipEntry::CreateInfo(ZipEntryInfo *__return_storage_ptr__,string *name)

{
  char *__src;
  time_t tVar1;
  
  GetNewIndex(unsigned_int)::index = GetNewIndex(unsigned_int)::index + 1;
  __return_storage_ptr__->m_file_index = GetNewIndex(unsigned_int)::index;
  __return_storage_ptr__->m_central_dir_ofs = 0;
  __return_storage_ptr__->m_version_made_by = 0;
  __return_storage_ptr__->m_version_needed = 0;
  __return_storage_ptr__->m_bit_flag = 0;
  __return_storage_ptr__->m_method = 0;
  tVar1 = time((time_t *)0x0);
  __return_storage_ptr__->m_time = tVar1;
  __return_storage_ptr__->m_crc32 = 0;
  __return_storage_ptr__->m_internal_attr = 0;
  __return_storage_ptr__->m_comp_size = 0;
  __return_storage_ptr__->m_uncomp_size = 0;
  *(undefined8 *)&__return_storage_ptr__->m_external_attr = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->m_local_header_ofs + 4) = 0;
  __src = (name->_M_dataplus)._M_p;
  __return_storage_ptr__->m_is_directory = (uint)(__src[name->_M_string_length - 1] == '/');
  __return_storage_ptr__->m_is_encrypted = 0;
  __return_storage_ptr__->m_is_supported = 1;
  strncpy(__return_storage_ptr__->m_filename,__src,0x200);
  __return_storage_ptr__->m_comment[0] = '\0';
  __return_storage_ptr__->m_comment[1] = '\0';
  __return_storage_ptr__->m_comment[2] = '\0';
  __return_storage_ptr__->m_comment[3] = '\0';
  __return_storage_ptr__->m_comment[4] = '\0';
  __return_storage_ptr__->m_comment[5] = '\0';
  __return_storage_ptr__->m_comment[6] = '\0';
  __return_storage_ptr__->m_comment[7] = '\0';
  __return_storage_ptr__->m_comment[8] = '\0';
  __return_storage_ptr__->m_comment[9] = '\0';
  __return_storage_ptr__->m_comment[10] = '\0';
  __return_storage_ptr__->m_comment[0xb] = '\0';
  __return_storage_ptr__->m_comment[0xc] = '\0';
  __return_storage_ptr__->m_comment[0xd] = '\0';
  __return_storage_ptr__->m_comment[0xe] = '\0';
  __return_storage_ptr__->m_comment[0xf] = '\0';
  __return_storage_ptr__->m_comment[0x10] = '\0';
  __return_storage_ptr__->m_comment[0x11] = '\0';
  __return_storage_ptr__->m_comment[0x12] = '\0';
  __return_storage_ptr__->m_comment[0x13] = '\0';
  __return_storage_ptr__->m_comment[0x14] = '\0';
  __return_storage_ptr__->m_comment[0x15] = '\0';
  __return_storage_ptr__->m_comment[0x16] = '\0';
  __return_storage_ptr__->m_comment[0x17] = '\0';
  __return_storage_ptr__->m_comment[0x18] = '\0';
  __return_storage_ptr__->m_comment[0x19] = '\0';
  __return_storage_ptr__->m_comment[0x1a] = '\0';
  __return_storage_ptr__->m_comment[0x1b] = '\0';
  __return_storage_ptr__->m_comment[0x1c] = '\0';
  __return_storage_ptr__->m_comment[0x1d] = '\0';
  __return_storage_ptr__->m_comment[0x1e] = '\0';
  __return_storage_ptr__->m_comment[0x1f] = '\0';
  __return_storage_ptr__->m_comment[0x20] = '\0';
  __return_storage_ptr__->m_comment[0x21] = '\0';
  __return_storage_ptr__->m_comment[0x22] = '\0';
  __return_storage_ptr__->m_comment[0x23] = '\0';
  __return_storage_ptr__->m_comment[0x24] = '\0';
  __return_storage_ptr__->m_comment[0x25] = '\0';
  __return_storage_ptr__->m_comment[0x26] = '\0';
  __return_storage_ptr__->m_comment[0x27] = '\0';
  __return_storage_ptr__->m_comment[0x28] = '\0';
  __return_storage_ptr__->m_comment[0x29] = '\0';
  __return_storage_ptr__->m_comment[0x2a] = '\0';
  __return_storage_ptr__->m_comment[0x2b] = '\0';
  __return_storage_ptr__->m_comment[0x2c] = '\0';
  __return_storage_ptr__->m_comment[0x2d] = '\0';
  __return_storage_ptr__->m_comment[0x2e] = '\0';
  __return_storage_ptr__->m_comment[0x2f] = '\0';
  __return_storage_ptr__->m_comment[0x30] = '\0';
  __return_storage_ptr__->m_comment[0x31] = '\0';
  __return_storage_ptr__->m_comment[0x32] = '\0';
  __return_storage_ptr__->m_comment[0x33] = '\0';
  __return_storage_ptr__->m_comment[0x34] = '\0';
  __return_storage_ptr__->m_comment[0x35] = '\0';
  __return_storage_ptr__->m_comment[0x36] = '\0';
  __return_storage_ptr__->m_comment[0x37] = '\0';
  __return_storage_ptr__->m_comment[0x38] = '\0';
  __return_storage_ptr__->m_comment[0x39] = '\0';
  __return_storage_ptr__->m_comment[0x3a] = '\0';
  __return_storage_ptr__->m_comment[0x3b] = '\0';
  __return_storage_ptr__->m_comment[0x3c] = '\0';
  __return_storage_ptr__->m_comment[0x3d] = '\0';
  __return_storage_ptr__->m_comment[0x3e] = '\0';
  __return_storage_ptr__->m_comment[0x3f] = '\0';
  __return_storage_ptr__->m_comment[0x40] = '\0';
  __return_storage_ptr__->m_comment[0x41] = '\0';
  __return_storage_ptr__->m_comment[0x42] = '\0';
  __return_storage_ptr__->m_comment[0x43] = '\0';
  __return_storage_ptr__->m_comment[0x44] = '\0';
  __return_storage_ptr__->m_comment[0x45] = '\0';
  __return_storage_ptr__->m_comment[0x46] = '\0';
  __return_storage_ptr__->m_comment[0x47] = '\0';
  __return_storage_ptr__->m_comment[0x48] = '\0';
  __return_storage_ptr__->m_comment[0x49] = '\0';
  __return_storage_ptr__->m_comment[0x4a] = '\0';
  __return_storage_ptr__->m_comment[0x4b] = '\0';
  __return_storage_ptr__->m_comment[0x4c] = '\0';
  __return_storage_ptr__->m_comment[0x4d] = '\0';
  __return_storage_ptr__->m_comment[0x4e] = '\0';
  __return_storage_ptr__->m_comment[0x4f] = '\0';
  __return_storage_ptr__->m_comment[0x50] = '\0';
  __return_storage_ptr__->m_comment[0x51] = '\0';
  __return_storage_ptr__->m_comment[0x52] = '\0';
  __return_storage_ptr__->m_comment[0x53] = '\0';
  __return_storage_ptr__->m_comment[0x54] = '\0';
  __return_storage_ptr__->m_comment[0x55] = '\0';
  __return_storage_ptr__->m_comment[0x56] = '\0';
  __return_storage_ptr__->m_comment[0x57] = '\0';
  __return_storage_ptr__->m_comment[0x58] = '\0';
  __return_storage_ptr__->m_comment[0x59] = '\0';
  __return_storage_ptr__->m_comment[0x5a] = '\0';
  __return_storage_ptr__->m_comment[0x5b] = '\0';
  __return_storage_ptr__->m_comment[0x5c] = '\0';
  __return_storage_ptr__->m_comment[0x5d] = '\0';
  __return_storage_ptr__->m_comment[0x5e] = '\0';
  __return_storage_ptr__->m_comment[0x5f] = '\0';
  __return_storage_ptr__->m_comment[0x60] = '\0';
  __return_storage_ptr__->m_comment[0x61] = '\0';
  __return_storage_ptr__->m_comment[0x62] = '\0';
  __return_storage_ptr__->m_comment[99] = '\0';
  __return_storage_ptr__->m_comment[100] = '\0';
  __return_storage_ptr__->m_comment[0x65] = '\0';
  __return_storage_ptr__->m_comment[0x66] = '\0';
  __return_storage_ptr__->m_comment[0x67] = '\0';
  __return_storage_ptr__->m_comment[0x68] = '\0';
  __return_storage_ptr__->m_comment[0x69] = '\0';
  __return_storage_ptr__->m_comment[0x6a] = '\0';
  __return_storage_ptr__->m_comment[0x6b] = '\0';
  __return_storage_ptr__->m_comment[0x6c] = '\0';
  __return_storage_ptr__->m_comment[0x6d] = '\0';
  __return_storage_ptr__->m_comment[0x6e] = '\0';
  __return_storage_ptr__->m_comment[0x6f] = '\0';
  __return_storage_ptr__->m_comment[0x70] = '\0';
  __return_storage_ptr__->m_comment[0x71] = '\0';
  __return_storage_ptr__->m_comment[0x72] = '\0';
  __return_storage_ptr__->m_comment[0x73] = '\0';
  __return_storage_ptr__->m_comment[0x74] = '\0';
  __return_storage_ptr__->m_comment[0x75] = '\0';
  __return_storage_ptr__->m_comment[0x76] = '\0';
  __return_storage_ptr__->m_comment[0x77] = '\0';
  __return_storage_ptr__->m_comment[0x78] = '\0';
  __return_storage_ptr__->m_comment[0x79] = '\0';
  __return_storage_ptr__->m_comment[0x7a] = '\0';
  __return_storage_ptr__->m_comment[0x7b] = '\0';
  __return_storage_ptr__->m_comment[0x7c] = '\0';
  __return_storage_ptr__->m_comment[0x7d] = '\0';
  __return_storage_ptr__->m_comment[0x7e] = '\0';
  __return_storage_ptr__->m_comment[0x7f] = '\0';
  __return_storage_ptr__->m_comment[0x80] = '\0';
  __return_storage_ptr__->m_comment[0x81] = '\0';
  __return_storage_ptr__->m_comment[0x82] = '\0';
  __return_storage_ptr__->m_comment[0x83] = '\0';
  __return_storage_ptr__->m_comment[0x84] = '\0';
  __return_storage_ptr__->m_comment[0x85] = '\0';
  __return_storage_ptr__->m_comment[0x86] = '\0';
  __return_storage_ptr__->m_comment[0x87] = '\0';
  __return_storage_ptr__->m_comment[0x88] = '\0';
  __return_storage_ptr__->m_comment[0x89] = '\0';
  __return_storage_ptr__->m_comment[0x8a] = '\0';
  __return_storage_ptr__->m_comment[0x8b] = '\0';
  __return_storage_ptr__->m_comment[0x8c] = '\0';
  __return_storage_ptr__->m_comment[0x8d] = '\0';
  __return_storage_ptr__->m_comment[0x8e] = '\0';
  __return_storage_ptr__->m_comment[0x8f] = '\0';
  __return_storage_ptr__->m_comment[0x90] = '\0';
  __return_storage_ptr__->m_comment[0x91] = '\0';
  __return_storage_ptr__->m_comment[0x92] = '\0';
  __return_storage_ptr__->m_comment[0x93] = '\0';
  __return_storage_ptr__->m_comment[0x94] = '\0';
  __return_storage_ptr__->m_comment[0x95] = '\0';
  __return_storage_ptr__->m_comment[0x96] = '\0';
  __return_storage_ptr__->m_comment[0x97] = '\0';
  __return_storage_ptr__->m_comment[0x98] = '\0';
  __return_storage_ptr__->m_comment[0x99] = '\0';
  __return_storage_ptr__->m_comment[0x9a] = '\0';
  __return_storage_ptr__->m_comment[0x9b] = '\0';
  __return_storage_ptr__->m_comment[0x9c] = '\0';
  __return_storage_ptr__->m_comment[0x9d] = '\0';
  __return_storage_ptr__->m_comment[0x9e] = '\0';
  __return_storage_ptr__->m_comment[0x9f] = '\0';
  __return_storage_ptr__->m_comment[0xa0] = '\0';
  __return_storage_ptr__->m_comment[0xa1] = '\0';
  __return_storage_ptr__->m_comment[0xa2] = '\0';
  __return_storage_ptr__->m_comment[0xa3] = '\0';
  __return_storage_ptr__->m_comment[0xa4] = '\0';
  __return_storage_ptr__->m_comment[0xa5] = '\0';
  __return_storage_ptr__->m_comment[0xa6] = '\0';
  __return_storage_ptr__->m_comment[0xa7] = '\0';
  __return_storage_ptr__->m_comment[0xa8] = '\0';
  __return_storage_ptr__->m_comment[0xa9] = '\0';
  __return_storage_ptr__->m_comment[0xaa] = '\0';
  __return_storage_ptr__->m_comment[0xab] = '\0';
  __return_storage_ptr__->m_comment[0xac] = '\0';
  __return_storage_ptr__->m_comment[0xad] = '\0';
  __return_storage_ptr__->m_comment[0xae] = '\0';
  __return_storage_ptr__->m_comment[0xaf] = '\0';
  __return_storage_ptr__->m_comment[0xb0] = '\0';
  __return_storage_ptr__->m_comment[0xb1] = '\0';
  __return_storage_ptr__->m_comment[0xb2] = '\0';
  __return_storage_ptr__->m_comment[0xb3] = '\0';
  __return_storage_ptr__->m_comment[0xb4] = '\0';
  __return_storage_ptr__->m_comment[0xb5] = '\0';
  __return_storage_ptr__->m_comment[0xb6] = '\0';
  __return_storage_ptr__->m_comment[0xb7] = '\0';
  __return_storage_ptr__->m_comment[0xb8] = '\0';
  __return_storage_ptr__->m_comment[0xb9] = '\0';
  __return_storage_ptr__->m_comment[0xba] = '\0';
  __return_storage_ptr__->m_comment[0xbb] = '\0';
  __return_storage_ptr__->m_comment[0xbc] = '\0';
  __return_storage_ptr__->m_comment[0xbd] = '\0';
  __return_storage_ptr__->m_comment[0xbe] = '\0';
  __return_storage_ptr__->m_comment[0xbf] = '\0';
  __return_storage_ptr__->m_comment[0xc0] = '\0';
  __return_storage_ptr__->m_comment[0xc1] = '\0';
  __return_storage_ptr__->m_comment[0xc2] = '\0';
  __return_storage_ptr__->m_comment[0xc3] = '\0';
  __return_storage_ptr__->m_comment[0xc4] = '\0';
  __return_storage_ptr__->m_comment[0xc5] = '\0';
  __return_storage_ptr__->m_comment[0xc6] = '\0';
  __return_storage_ptr__->m_comment[199] = '\0';
  __return_storage_ptr__->m_comment[200] = '\0';
  __return_storage_ptr__->m_comment[0xc9] = '\0';
  __return_storage_ptr__->m_comment[0xca] = '\0';
  __return_storage_ptr__->m_comment[0xcb] = '\0';
  __return_storage_ptr__->m_comment[0xcc] = '\0';
  __return_storage_ptr__->m_comment[0xcd] = '\0';
  __return_storage_ptr__->m_comment[0xce] = '\0';
  __return_storage_ptr__->m_comment[0xcf] = '\0';
  __return_storage_ptr__->m_comment[0xd0] = '\0';
  __return_storage_ptr__->m_comment[0xd1] = '\0';
  __return_storage_ptr__->m_comment[0xd2] = '\0';
  __return_storage_ptr__->m_comment[0xd3] = '\0';
  __return_storage_ptr__->m_comment[0xd4] = '\0';
  __return_storage_ptr__->m_comment[0xd5] = '\0';
  __return_storage_ptr__->m_comment[0xd6] = '\0';
  __return_storage_ptr__->m_comment[0xd7] = '\0';
  __return_storage_ptr__->m_comment[0xd8] = '\0';
  __return_storage_ptr__->m_comment[0xd9] = '\0';
  __return_storage_ptr__->m_comment[0xda] = '\0';
  __return_storage_ptr__->m_comment[0xdb] = '\0';
  __return_storage_ptr__->m_comment[0xdc] = '\0';
  __return_storage_ptr__->m_comment[0xdd] = '\0';
  __return_storage_ptr__->m_comment[0xde] = '\0';
  __return_storage_ptr__->m_comment[0xdf] = '\0';
  __return_storage_ptr__->m_comment[0xe0] = '\0';
  __return_storage_ptr__->m_comment[0xe1] = '\0';
  __return_storage_ptr__->m_comment[0xe2] = '\0';
  __return_storage_ptr__->m_comment[0xe3] = '\0';
  __return_storage_ptr__->m_comment[0xe4] = '\0';
  __return_storage_ptr__->m_comment[0xe5] = '\0';
  __return_storage_ptr__->m_comment[0xe6] = '\0';
  __return_storage_ptr__->m_comment[0xe7] = '\0';
  __return_storage_ptr__->m_comment[0xe8] = '\0';
  __return_storage_ptr__->m_comment[0xe9] = '\0';
  __return_storage_ptr__->m_comment[0xea] = '\0';
  __return_storage_ptr__->m_comment[0xeb] = '\0';
  __return_storage_ptr__->m_comment[0xec] = '\0';
  __return_storage_ptr__->m_comment[0xed] = '\0';
  __return_storage_ptr__->m_comment[0xee] = '\0';
  __return_storage_ptr__->m_comment[0xef] = '\0';
  __return_storage_ptr__->m_comment[0xf0] = '\0';
  __return_storage_ptr__->m_comment[0xf1] = '\0';
  __return_storage_ptr__->m_comment[0xf2] = '\0';
  __return_storage_ptr__->m_comment[0xf3] = '\0';
  __return_storage_ptr__->m_comment[0xf4] = '\0';
  __return_storage_ptr__->m_comment[0xf5] = '\0';
  __return_storage_ptr__->m_comment[0xf6] = '\0';
  __return_storage_ptr__->m_comment[0xf7] = '\0';
  __return_storage_ptr__->m_comment[0xf8] = '\0';
  __return_storage_ptr__->m_comment[0xf9] = '\0';
  __return_storage_ptr__->m_comment[0xfa] = '\0';
  __return_storage_ptr__->m_comment[0xfb] = '\0';
  __return_storage_ptr__->m_comment[0xfc] = '\0';
  __return_storage_ptr__->m_comment[0xfd] = '\0';
  __return_storage_ptr__->m_comment[0xfe] = '\0';
  __return_storage_ptr__->m_comment[0xff] = '\0';
  __return_storage_ptr__->m_comment[0x100] = '\0';
  __return_storage_ptr__->m_comment[0x101] = '\0';
  __return_storage_ptr__->m_comment[0x102] = '\0';
  __return_storage_ptr__->m_comment[0x103] = '\0';
  __return_storage_ptr__->m_comment[0x104] = '\0';
  __return_storage_ptr__->m_comment[0x105] = '\0';
  __return_storage_ptr__->m_comment[0x106] = '\0';
  __return_storage_ptr__->m_comment[0x107] = '\0';
  __return_storage_ptr__->m_comment[0x108] = '\0';
  __return_storage_ptr__->m_comment[0x109] = '\0';
  __return_storage_ptr__->m_comment[0x10a] = '\0';
  __return_storage_ptr__->m_comment[0x10b] = '\0';
  __return_storage_ptr__->m_comment[0x10c] = '\0';
  __return_storage_ptr__->m_comment[0x10d] = '\0';
  __return_storage_ptr__->m_comment[0x10e] = '\0';
  __return_storage_ptr__->m_comment[0x10f] = '\0';
  __return_storage_ptr__->m_comment[0x110] = '\0';
  __return_storage_ptr__->m_comment[0x111] = '\0';
  __return_storage_ptr__->m_comment[0x112] = '\0';
  __return_storage_ptr__->m_comment[0x113] = '\0';
  __return_storage_ptr__->m_comment[0x114] = '\0';
  __return_storage_ptr__->m_comment[0x115] = '\0';
  __return_storage_ptr__->m_comment[0x116] = '\0';
  __return_storage_ptr__->m_comment[0x117] = '\0';
  __return_storage_ptr__->m_comment[0x118] = '\0';
  __return_storage_ptr__->m_comment[0x119] = '\0';
  __return_storage_ptr__->m_comment[0x11a] = '\0';
  __return_storage_ptr__->m_comment[0x11b] = '\0';
  __return_storage_ptr__->m_comment[0x11c] = '\0';
  __return_storage_ptr__->m_comment[0x11d] = '\0';
  __return_storage_ptr__->m_comment[0x11e] = '\0';
  __return_storage_ptr__->m_comment[0x11f] = '\0';
  __return_storage_ptr__->m_comment[0x120] = '\0';
  __return_storage_ptr__->m_comment[0x121] = '\0';
  __return_storage_ptr__->m_comment[0x122] = '\0';
  __return_storage_ptr__->m_comment[0x123] = '\0';
  __return_storage_ptr__->m_comment[0x124] = '\0';
  __return_storage_ptr__->m_comment[0x125] = '\0';
  __return_storage_ptr__->m_comment[0x126] = '\0';
  __return_storage_ptr__->m_comment[0x127] = '\0';
  __return_storage_ptr__->m_comment[0x128] = '\0';
  __return_storage_ptr__->m_comment[0x129] = '\0';
  __return_storage_ptr__->m_comment[0x12a] = '\0';
  __return_storage_ptr__->m_comment[299] = '\0';
  __return_storage_ptr__->m_comment[300] = '\0';
  __return_storage_ptr__->m_comment[0x12d] = '\0';
  __return_storage_ptr__->m_comment[0x12e] = '\0';
  __return_storage_ptr__->m_comment[0x12f] = '\0';
  __return_storage_ptr__->m_comment[0x130] = '\0';
  __return_storage_ptr__->m_comment[0x131] = '\0';
  __return_storage_ptr__->m_comment[0x132] = '\0';
  __return_storage_ptr__->m_comment[0x133] = '\0';
  __return_storage_ptr__->m_comment[0x134] = '\0';
  __return_storage_ptr__->m_comment[0x135] = '\0';
  __return_storage_ptr__->m_comment[0x136] = '\0';
  __return_storage_ptr__->m_comment[0x137] = '\0';
  __return_storage_ptr__->m_comment[0x138] = '\0';
  __return_storage_ptr__->m_comment[0x139] = '\0';
  __return_storage_ptr__->m_comment[0x13a] = '\0';
  __return_storage_ptr__->m_comment[0x13b] = '\0';
  __return_storage_ptr__->m_comment[0x13c] = '\0';
  __return_storage_ptr__->m_comment[0x13d] = '\0';
  __return_storage_ptr__->m_comment[0x13e] = '\0';
  __return_storage_ptr__->m_comment[0x13f] = '\0';
  __return_storage_ptr__->m_comment[0x140] = '\0';
  __return_storage_ptr__->m_comment[0x141] = '\0';
  __return_storage_ptr__->m_comment[0x142] = '\0';
  __return_storage_ptr__->m_comment[0x143] = '\0';
  __return_storage_ptr__->m_comment[0x144] = '\0';
  __return_storage_ptr__->m_comment[0x145] = '\0';
  __return_storage_ptr__->m_comment[0x146] = '\0';
  __return_storage_ptr__->m_comment[0x147] = '\0';
  __return_storage_ptr__->m_comment[0x148] = '\0';
  __return_storage_ptr__->m_comment[0x149] = '\0';
  __return_storage_ptr__->m_comment[0x14a] = '\0';
  __return_storage_ptr__->m_comment[0x14b] = '\0';
  __return_storage_ptr__->m_comment[0x14c] = '\0';
  __return_storage_ptr__->m_comment[0x14d] = '\0';
  __return_storage_ptr__->m_comment[0x14e] = '\0';
  __return_storage_ptr__->m_comment[0x14f] = '\0';
  __return_storage_ptr__->m_comment[0x150] = '\0';
  __return_storage_ptr__->m_comment[0x151] = '\0';
  __return_storage_ptr__->m_comment[0x152] = '\0';
  __return_storage_ptr__->m_comment[0x153] = '\0';
  __return_storage_ptr__->m_comment[0x154] = '\0';
  __return_storage_ptr__->m_comment[0x155] = '\0';
  __return_storage_ptr__->m_comment[0x156] = '\0';
  __return_storage_ptr__->m_comment[0x157] = '\0';
  __return_storage_ptr__->m_comment[0x158] = '\0';
  __return_storage_ptr__->m_comment[0x159] = '\0';
  __return_storage_ptr__->m_comment[0x15a] = '\0';
  __return_storage_ptr__->m_comment[0x15b] = '\0';
  __return_storage_ptr__->m_comment[0x15c] = '\0';
  __return_storage_ptr__->m_comment[0x15d] = '\0';
  __return_storage_ptr__->m_comment[0x15e] = '\0';
  __return_storage_ptr__->m_comment[0x15f] = '\0';
  __return_storage_ptr__->m_comment[0x160] = '\0';
  __return_storage_ptr__->m_comment[0x161] = '\0';
  __return_storage_ptr__->m_comment[0x162] = '\0';
  __return_storage_ptr__->m_comment[0x163] = '\0';
  __return_storage_ptr__->m_comment[0x164] = '\0';
  __return_storage_ptr__->m_comment[0x165] = '\0';
  __return_storage_ptr__->m_comment[0x166] = '\0';
  __return_storage_ptr__->m_comment[0x167] = '\0';
  __return_storage_ptr__->m_comment[0x168] = '\0';
  __return_storage_ptr__->m_comment[0x169] = '\0';
  __return_storage_ptr__->m_comment[0x16a] = '\0';
  __return_storage_ptr__->m_comment[0x16b] = '\0';
  __return_storage_ptr__->m_comment[0x16c] = '\0';
  __return_storage_ptr__->m_comment[0x16d] = '\0';
  __return_storage_ptr__->m_comment[0x16e] = '\0';
  __return_storage_ptr__->m_comment[0x16f] = '\0';
  __return_storage_ptr__->m_comment[0x170] = '\0';
  __return_storage_ptr__->m_comment[0x171] = '\0';
  __return_storage_ptr__->m_comment[0x172] = '\0';
  __return_storage_ptr__->m_comment[0x173] = '\0';
  __return_storage_ptr__->m_comment[0x174] = '\0';
  __return_storage_ptr__->m_comment[0x175] = '\0';
  __return_storage_ptr__->m_comment[0x176] = '\0';
  __return_storage_ptr__->m_comment[0x177] = '\0';
  __return_storage_ptr__->m_comment[0x178] = '\0';
  __return_storage_ptr__->m_comment[0x179] = '\0';
  __return_storage_ptr__->m_comment[0x17a] = '\0';
  __return_storage_ptr__->m_comment[0x17b] = '\0';
  __return_storage_ptr__->m_comment[0x17c] = '\0';
  __return_storage_ptr__->m_comment[0x17d] = '\0';
  __return_storage_ptr__->m_comment[0x17e] = '\0';
  __return_storage_ptr__->m_comment[0x17f] = '\0';
  __return_storage_ptr__->m_comment[0x180] = '\0';
  __return_storage_ptr__->m_comment[0x181] = '\0';
  __return_storage_ptr__->m_comment[0x182] = '\0';
  __return_storage_ptr__->m_comment[0x183] = '\0';
  __return_storage_ptr__->m_comment[0x184] = '\0';
  __return_storage_ptr__->m_comment[0x185] = '\0';
  __return_storage_ptr__->m_comment[0x186] = '\0';
  __return_storage_ptr__->m_comment[0x187] = '\0';
  __return_storage_ptr__->m_comment[0x188] = '\0';
  __return_storage_ptr__->m_comment[0x189] = '\0';
  __return_storage_ptr__->m_comment[0x18a] = '\0';
  __return_storage_ptr__->m_comment[0x18b] = '\0';
  __return_storage_ptr__->m_comment[0x18c] = '\0';
  __return_storage_ptr__->m_comment[0x18d] = '\0';
  __return_storage_ptr__->m_comment[0x18e] = '\0';
  __return_storage_ptr__->m_comment[399] = '\0';
  __return_storage_ptr__->m_comment[400] = '\0';
  __return_storage_ptr__->m_comment[0x191] = '\0';
  __return_storage_ptr__->m_comment[0x192] = '\0';
  __return_storage_ptr__->m_comment[0x193] = '\0';
  __return_storage_ptr__->m_comment[0x194] = '\0';
  __return_storage_ptr__->m_comment[0x195] = '\0';
  __return_storage_ptr__->m_comment[0x196] = '\0';
  __return_storage_ptr__->m_comment[0x197] = '\0';
  __return_storage_ptr__->m_comment[0x198] = '\0';
  __return_storage_ptr__->m_comment[0x199] = '\0';
  __return_storage_ptr__->m_comment[0x19a] = '\0';
  __return_storage_ptr__->m_comment[0x19b] = '\0';
  __return_storage_ptr__->m_comment[0x19c] = '\0';
  __return_storage_ptr__->m_comment[0x19d] = '\0';
  __return_storage_ptr__->m_comment[0x19e] = '\0';
  __return_storage_ptr__->m_comment[0x19f] = '\0';
  __return_storage_ptr__->m_comment[0x1a0] = '\0';
  __return_storage_ptr__->m_comment[0x1a1] = '\0';
  __return_storage_ptr__->m_comment[0x1a2] = '\0';
  __return_storage_ptr__->m_comment[0x1a3] = '\0';
  __return_storage_ptr__->m_comment[0x1a4] = '\0';
  __return_storage_ptr__->m_comment[0x1a5] = '\0';
  __return_storage_ptr__->m_comment[0x1a6] = '\0';
  __return_storage_ptr__->m_comment[0x1a7] = '\0';
  __return_storage_ptr__->m_comment[0x1a8] = '\0';
  __return_storage_ptr__->m_comment[0x1a9] = '\0';
  __return_storage_ptr__->m_comment[0x1aa] = '\0';
  __return_storage_ptr__->m_comment[0x1ab] = '\0';
  __return_storage_ptr__->m_comment[0x1ac] = '\0';
  __return_storage_ptr__->m_comment[0x1ad] = '\0';
  __return_storage_ptr__->m_comment[0x1ae] = '\0';
  __return_storage_ptr__->m_comment[0x1af] = '\0';
  __return_storage_ptr__->m_comment[0x1b0] = '\0';
  __return_storage_ptr__->m_comment[0x1b1] = '\0';
  __return_storage_ptr__->m_comment[0x1b2] = '\0';
  __return_storage_ptr__->m_comment[0x1b3] = '\0';
  __return_storage_ptr__->m_comment[0x1b4] = '\0';
  __return_storage_ptr__->m_comment[0x1b5] = '\0';
  __return_storage_ptr__->m_comment[0x1b6] = '\0';
  __return_storage_ptr__->m_comment[0x1b7] = '\0';
  __return_storage_ptr__->m_comment[0x1b8] = '\0';
  __return_storage_ptr__->m_comment[0x1b9] = '\0';
  __return_storage_ptr__->m_comment[0x1ba] = '\0';
  __return_storage_ptr__->m_comment[0x1bb] = '\0';
  __return_storage_ptr__->m_comment[0x1bc] = '\0';
  __return_storage_ptr__->m_comment[0x1bd] = '\0';
  __return_storage_ptr__->m_comment[0x1be] = '\0';
  __return_storage_ptr__->m_comment[0x1bf] = '\0';
  __return_storage_ptr__->m_comment[0x1c0] = '\0';
  __return_storage_ptr__->m_comment[0x1c1] = '\0';
  __return_storage_ptr__->m_comment[0x1c2] = '\0';
  __return_storage_ptr__->m_comment[0x1c3] = '\0';
  __return_storage_ptr__->m_comment[0x1c4] = '\0';
  __return_storage_ptr__->m_comment[0x1c5] = '\0';
  __return_storage_ptr__->m_comment[0x1c6] = '\0';
  __return_storage_ptr__->m_comment[0x1c7] = '\0';
  __return_storage_ptr__->m_comment[0x1c8] = '\0';
  __return_storage_ptr__->m_comment[0x1c9] = '\0';
  __return_storage_ptr__->m_comment[0x1ca] = '\0';
  __return_storage_ptr__->m_comment[0x1cb] = '\0';
  __return_storage_ptr__->m_comment[0x1cc] = '\0';
  __return_storage_ptr__->m_comment[0x1cd] = '\0';
  __return_storage_ptr__->m_comment[0x1ce] = '\0';
  __return_storage_ptr__->m_comment[0x1cf] = '\0';
  __return_storage_ptr__->m_comment[0x1d0] = '\0';
  __return_storage_ptr__->m_comment[0x1d1] = '\0';
  __return_storage_ptr__->m_comment[0x1d2] = '\0';
  __return_storage_ptr__->m_comment[0x1d3] = '\0';
  __return_storage_ptr__->m_comment[0x1d4] = '\0';
  __return_storage_ptr__->m_comment[0x1d5] = '\0';
  __return_storage_ptr__->m_comment[0x1d6] = '\0';
  __return_storage_ptr__->m_comment[0x1d7] = '\0';
  __return_storage_ptr__->m_comment[0x1d8] = '\0';
  __return_storage_ptr__->m_comment[0x1d9] = '\0';
  __return_storage_ptr__->m_comment[0x1da] = '\0';
  __return_storage_ptr__->m_comment[0x1db] = '\0';
  __return_storage_ptr__->m_comment[0x1dc] = '\0';
  __return_storage_ptr__->m_comment[0x1dd] = '\0';
  __return_storage_ptr__->m_comment[0x1de] = '\0';
  __return_storage_ptr__->m_comment[0x1df] = '\0';
  __return_storage_ptr__->m_comment[0x1e0] = '\0';
  __return_storage_ptr__->m_comment[0x1e1] = '\0';
  __return_storage_ptr__->m_comment[0x1e2] = '\0';
  __return_storage_ptr__->m_comment[0x1e3] = '\0';
  __return_storage_ptr__->m_comment[0x1e4] = '\0';
  __return_storage_ptr__->m_comment[0x1e5] = '\0';
  __return_storage_ptr__->m_comment[0x1e6] = '\0';
  __return_storage_ptr__->m_comment[0x1e7] = '\0';
  __return_storage_ptr__->m_comment[0x1e8] = '\0';
  __return_storage_ptr__->m_comment[0x1e9] = '\0';
  __return_storage_ptr__->m_comment[0x1ea] = '\0';
  __return_storage_ptr__->m_comment[0x1eb] = '\0';
  __return_storage_ptr__->m_comment[0x1ec] = '\0';
  __return_storage_ptr__->m_comment[0x1ed] = '\0';
  __return_storage_ptr__->m_comment[0x1ee] = '\0';
  __return_storage_ptr__->m_comment[0x1ef] = '\0';
  __return_storage_ptr__->m_comment[0x1f0] = '\0';
  __return_storage_ptr__->m_comment[0x1f1] = '\0';
  __return_storage_ptr__->m_comment[0x1f2] = '\0';
  __return_storage_ptr__->m_comment[499] = '\0';
  __return_storage_ptr__->m_comment[500] = '\0';
  __return_storage_ptr__->m_comment[0x1f5] = '\0';
  __return_storage_ptr__->m_comment[0x1f6] = '\0';
  __return_storage_ptr__->m_comment[0x1f7] = '\0';
  __return_storage_ptr__->m_comment[0x1f8] = '\0';
  __return_storage_ptr__->m_comment[0x1f9] = '\0';
  __return_storage_ptr__->m_comment[0x1fa] = '\0';
  __return_storage_ptr__->m_comment[0x1fb] = '\0';
  __return_storage_ptr__->m_comment[0x1fc] = '\0';
  __return_storage_ptr__->m_comment[0x1fd] = '\0';
  __return_storage_ptr__->m_comment[0x1fe] = '\0';
  __return_storage_ptr__->m_comment[0x1ff] = '\0';
  return __return_storage_ptr__;
}

Assistant:

static ZipEntryInfo CreateInfo(const std::string& name) {

                ZipEntryInfo info;

                info.m_file_index       = GetNewIndex(0);
                info.m_central_dir_ofs  = 0;
                info.m_version_made_by  = 0;
                info.m_version_needed   = 0;
                info.m_bit_flag         = 0;
                info.m_method           = 0;
                info.m_time             = time(nullptr);
                info.m_crc32            = 0;
                info.m_comp_size        = 0;
                info.m_uncomp_size      = 0;
                info.m_internal_attr    = 0;
                info.m_external_attr    = 0;
                info.m_local_header_ofs = 0;
                info.m_comment_size     = 0;
                info.m_is_directory     = (name.back() == '/');
                info.m_is_encrypted     = false;
                info.m_is_supported     = true;

#if _MSC_VER    // On MSVC, use the safe version of strcpy
                strcpy_s(info.m_filename, sizeof info.m_filename, name.c_str());
                strcpy_s(info.m_comment, sizeof info.m_comment, "");
#else           // Otherwise, use the unsafe version as fallback :(
                strncpy(info.m_filename, name.c_str(), sizeof info.m_filename);
                strncpy(info.m_comment, "", sizeof info.m_comment);
#endif

                return info;
            }